

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_setpoint::Reset(ChFunctionRotation_setpoint *this,double s)

{
  this->S = s;
  if (this != (ChFunctionRotation_setpoint *)&DAT_00b90958) {
    (this->Q).m_data[0] = QUNIT;
    (this->Q).m_data[1] = DAT_00b90978;
    (this->Q).m_data[2] = DAT_00b90980;
    (this->Q).m_data[3] = DAT_00b90988;
  }
  (this->A).m_data[0] = 0.0;
  (this->A).m_data[1] = 0.0;
  (this->A).m_data[2] = 0.0;
  this->last_S = 0.0;
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  if (this != (ChFunctionRotation_setpoint *)&ChClassFactory::GetGlobalClassFactory::mfactory) {
    (this->last_Q).m_data[0] = QUNIT;
    (this->last_Q).m_data[1] = DAT_00b90978;
    (this->last_Q).m_data[2] = DAT_00b90980;
    (this->last_Q).m_data[3] = DAT_00b90988;
  }
  (this->last_W).m_data[0] = 0.0;
  (this->last_W).m_data[1] = 0.0;
  (this->last_W).m_data[2] = 0.0;
  return;
}

Assistant:

void ChFunctionRotation_setpoint::Reset(double s) {
    S = s;
    Q = QUNIT;
    W = 0;
    A = 0;
    last_S = 0;
    last_Q = QUNIT;
    last_W = 0;
}